

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLTools.h
# Opt level: O1

string * Assimp::XMLEscape(string *__return_storage_ptr__,string *data)

{
  size_type sVar1;
  size_type sVar2;
  char c;
  byte local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = data->_M_string_length;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      local_39 = (data->_M_dataplus)._M_p[sVar2];
      if (local_39 < 0x27) {
        if ((local_39 != 0x22) && (local_39 != 0x26)) goto LAB_003157b0;
LAB_0031579e:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((local_39 == 0x27) || ((local_39 == 0x3c || (local_39 == 0x3e)))) goto LAB_0031579e;
LAB_003157b0:
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_39);
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XMLEscape(const std::string& data) {
        std::string buffer;

        const size_t size = data.size();
        buffer.reserve(size + size / 8);
        for(size_t i = 0; i < size; ++i) {
            const char c = data[i];
            switch(c) {
                case '&' :
                    buffer.append("&amp;");
                    break;
                case '\"':
                    buffer.append("&quot;");
                    break;
                case '\'':
                    buffer.append("&apos;");
                    break;
                case '<' :
                    buffer.append("&lt;");
                    break;
                case '>' :
                    buffer.append("&gt;");
                    break;
                default:
                    buffer.append(&c, 1);
                    break;
            }
        }
        return buffer;
    }